

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O2

Pool<A,_8192UL> * __thiscall entityx::EntityManager::accomodate_component<A>(EntityManager *this)

{
  vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_> *this_00;
  value_type in_RAX;
  Family FVar1;
  long lVar2;
  BasePool *this_01;
  undefined8 *puVar3;
  value_type local_28;
  
  local_28 = in_RAX;
  FVar1 = Component<A>::family();
  this_00 = (vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_> *)(this + 0x18);
  lVar2 = *(long *)(this + 0x18);
  if ((ulong)(*(long *)(this + 0x20) - lVar2 >> 3) <= FVar1) {
    local_28 = (value_type)0x0;
    Catch::clara::std::vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>::resize
              (this_00,FVar1 + 1,&local_28);
    lVar2 = *(long *)this_00;
  }
  if (*(long *)(lVar2 + FVar1 * 8) == 0) {
    this_01 = (BasePool *)operator_new(0x40);
    *(undefined8 *)(this_01 + 0x18) = 0;
    *(undefined8 *)(this_01 + 8) = 0;
    *(undefined8 *)(this_01 + 0x10) = 0;
    *(undefined8 *)(this_01 + 0x20) = 1;
    *(undefined8 *)(this_01 + 0x28) = 0x2000;
    *(undefined8 *)(this_01 + 0x30) = 0;
    *(undefined8 *)(this_01 + 0x38) = 0;
    *(undefined ***)this_01 = &PTR__BasePool_001eadb0;
    BasePool::expand(this_01,(ulong)*(uint *)(this + 8));
    *(BasePool **)(*(long *)(this + 0x18) + FVar1 * 8) = this_01;
  }
  lVar2 = *(long *)(this + 0x30);
  if ((ulong)(*(long *)(this + 0x38) - lVar2 >> 3) <= FVar1) {
    local_28 = (value_type)0x0;
    Catch::clara::std::
    vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>::resize
              ((vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>
                *)(this + 0x30),FVar1 + 1,(value_type *)&local_28);
    lVar2 = *(long *)(this + 0x30);
  }
  if (*(long *)(lVar2 + FVar1 * 8) == 0) {
    puVar3 = (undefined8 *)operator_new(8);
    *puVar3 = &PTR__BaseComponentHelper_001eadf0;
    *(undefined8 **)(lVar2 + FVar1 * 8) = puVar3;
  }
  return *(Pool<A,_8192UL> **)(*(long *)this_00 + FVar1 * 8);
}

Assistant:

Pool<C> *accomodate_component() {
    BaseComponent::Family family = component_family<C>();
    if (component_pools_.size() <= family) {
      component_pools_.resize(family + 1, nullptr);
    }
    if (!component_pools_[family]) {
      Pool<C> *pool = new Pool<C>();
      pool->expand(index_counter_);
      component_pools_[family] = pool;
    }
    if (component_helpers_.size() <= family) {
      component_helpers_.resize(family + 1, nullptr);
    }
    if (!component_helpers_[family]) {
      ComponentHelper<C> *helper = new ComponentHelper<C>();
      component_helpers_[family] = helper;
    }
    return static_cast<Pool<C>*>(component_pools_[family]);
  }